

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

void __thiscall Histogram::Histogram(Histogram *this,Histogram *src)

{
  void *pvVar1;
  long in_RDI;
  Histogram *in_stack_00000020;
  Histogram *in_stack_00000028;
  
  pvVar1 = operator_new__(0x208);
  *(void **)(in_RDI + 0x10) = pvVar1;
  operator=(in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

Histogram(const Histogram& src) {
        bins = new HistBin[MAX_BINS];
        // It will invoke `operator=()` below.
        *this = src;
    }